

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwitchIRBuilder.cpp
# Opt level: O2

void __thiscall
SwitchIRBuilder::BuildBinaryTraverseInstr
          (SwitchIRBuilder *this,int start,int end,uint32 defaultLeafBranch)

{
  int index;
  Type pCVar1;
  Type pCVar2;
  int iVar3;
  Type *ppCVar4;
  BranchInstr *pBVar5;
  int end_local;
  
  while( true ) {
    if (end < start) {
      return;
    }
    if (end - start <= DAT_01441e70 + -1) break;
    iVar3 = ((end - start) + 1) / 2;
    index = iVar3 + start;
    ppCVar4 = JsUtil::
              List<CaseNode_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item(this->m_caseNodes,index);
    pCVar1 = *ppCVar4;
    ppCVar4 = JsUtil::
              List<CaseNode_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item(this->m_caseNodes,start);
    pCVar2 = *ppCVar4;
    pBVar5 = IR::BranchInstr::New
                       (this->m_geOp,(LabelInstr *)0x0,(pCVar2->caseInstr->super_Instr).m_src1,
                        pCVar1->lowerBound,this->m_func);
    pBVar5->field_0x58 = pBVar5->field_0x58 | 2;
    (**this->m_adapter->_vptr_SwitchAdapter)
              (this->m_adapter,pBVar5,(ulong)pCVar2->offset,(ulong)pCVar1->offset,1);
    BuildBinaryTraverseInstr(this,start,iVar3 + start + -1,defaultLeafBranch);
    start = index;
  }
  BuildLinearTraverseInstr(this,start,end,defaultLeafBranch);
  return;
}

Assistant:

void
SwitchIRBuilder::BuildBinaryTraverseInstr(int start, int end, uint32 defaultLeafBranch)
{
    int mid;

    if (start > end)
    {
        return;
    }

    if (end - start <= CONFIG_FLAG(MaxLinearIntCaseCount) - 1) // -1 for handling zero index as the base
    {
        //if only 3 elements, then do linear search on the elements
        BuildLinearTraverseInstr(start, end, defaultLeafBranch);
        return;
    }

    mid = start + ((end - start + 1) / 2);
    CaseNode* midNode = m_caseNodes->Item(mid);
    CaseNode* startNode = m_caseNodes->Item(start);

    // if the value that we are switching on is greater than the start case value
    // then we branch right to the right half of the binary search
    IR::BranchInstr* caseInstr = startNode->GetCaseInstr();
    IR::BranchInstr* branchInstr = IR::BranchInstr::New(m_geOp, nullptr, caseInstr->GetSrc1(), midNode->GetLowerBound(), m_func);
    branchInstr->m_isSwitchBr = true;
    m_adapter->AddBranchInstr(branchInstr, startNode->GetOffset(), midNode->GetOffset(), true);

    BuildBinaryTraverseInstr(start, mid - 1, defaultLeafBranch);
    BuildBinaryTraverseInstr(mid, end, defaultLeafBranch);
}